

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O3

void __thiscall
slang::syntax::SyntaxTree::SyntaxTree
          (SyntaxTree *this,SyntaxNode *root,SourceManager *sourceManager,BumpAllocator *alloc,
          SourceLibrary *library,shared_ptr<slang::syntax::SyntaxTree> *parent)

{
  BumpAllocator *this_00;
  unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  *this_01;
  pointer *pppDVar1;
  iterator __position;
  pointer __p;
  pointer __p_00;
  element_type *peVar2;
  pointer ppDVar3;
  ulong uVar4;
  Token TVar5;
  value_type macro;
  ParserMetadata local_110;
  __uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  local_38;
  
  this->isLibraryUnit = false;
  this->rootNode = root;
  this->library = library;
  this->sourceMan = sourceManager;
  this_00 = &this->alloc;
  BumpAllocator::BumpAllocator(this_00,alloc);
  (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  (this->options_).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->options_).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_size_mask = 1;
  (this->options_).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->options_).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  this_01 = &this->metadata;
  (this->options_).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.ml = 0;
  (this->options_).items.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  .size_ctrl.size = 0;
  (this->metadata)._M_t.
  super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  ._M_t.
  super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
  .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl =
       (ParserMetadata *)0x0;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parsing::ParserMetadata::fromSyntax(&local_110,root);
  __p_00 = (pointer)operator_new(0xd8);
  (__p_00->nodeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.groups_ =
       local_110.nodeMap.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
       .arrays.groups_;
  (__p_00->nodeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.elements_ =
       local_110.nodeMap.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
       .arrays.elements_;
  (__p_00->nodeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.groups_size_index =
       local_110.nodeMap.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
       .arrays.groups_size_index;
  (__p_00->nodeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.groups_size_mask =
       local_110.nodeMap.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
       .arrays.groups_size_mask;
  (__p_00->nodeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .size_ctrl.ml =
       local_110.nodeMap.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
       .size_ctrl.ml;
  (__p_00->nodeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .size_ctrl.size =
       local_110.nodeMap.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
       .size_ctrl.size;
  local_110.nodeMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.groups_size_index = 0x3f;
  local_110.nodeMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.groups_size_mask = 1;
  local_110.nodeMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  local_110.nodeMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .size_ctrl.size = 0;
  local_110.nodeMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_110.nodeMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  .size_ctrl.ml = 0;
  (__p_00->globalInstances).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       local_110.globalInstances.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
       .arrays.groups_;
  (__p_00->globalInstances).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ =
       local_110.globalInstances.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
       .arrays.elements_;
  (__p_00->globalInstances).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index =
       local_110.globalInstances.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
       .arrays.groups_size_index;
  (__p_00->globalInstances).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask =
       local_110.globalInstances.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
       .arrays.groups_size_mask;
  (__p_00->globalInstances).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml =
       local_110.globalInstances.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
       .size_ctrl.ml;
  (__p_00->globalInstances).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.size =
       local_110.globalInstances.table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
       .size_ctrl.size;
  local_110.globalInstances.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index = 0x3f;
  local_110.globalInstances.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask = 1;
  local_110.globalInstances.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  local_110.globalInstances.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_110.globalInstances.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml = 0;
  local_110.globalInstances.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.size = 0;
  (__p_00->classPackageNames).
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_110.classPackageNames.
       super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p_00->classPackageNames).
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_110.classPackageNames.
       super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p_00->classPackageNames).
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_110.classPackageNames.
       super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_110.classPackageNames.
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.classPackageNames.
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.classPackageNames.
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->packageImports).
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_110.packageImports.
       super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p_00->packageImports).
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_110.packageImports.
       super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p_00->packageImports).
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_110.packageImports.
       super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_110.packageImports.
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.packageImports.
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.packageImports.
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->classDecls).
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_110.classDecls.
       super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p_00->classDecls).
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_110.classDecls.
       super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p_00->classDecls).
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_110.classDecls.
       super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_110.classDecls.
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.classDecls.
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.classDecls.
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->interfacePorts).
  super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_110.interfacePorts.
       super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p_00->interfacePorts).
  super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_110.interfacePorts.
       super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p_00->interfacePorts).
  super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_110.interfacePorts.
       super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_110.interfacePorts.
  super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.interfacePorts.
  super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.interfacePorts.
  super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __p_00->hasDefparams = local_110.hasDefparams;
  __p_00->hasBindDirectives = local_110.hasBindDirectives;
  (__p_00->eofToken).kind = local_110.eofToken.kind;
  (__p_00->eofToken).field_0x2 = local_110.eofToken._2_1_;
  (__p_00->eofToken).numFlags = (NumericTokenFlags)local_110.eofToken.numFlags.raw;
  (__p_00->eofToken).rawLen = local_110.eofToken.rawLen;
  (__p_00->eofToken).info = local_110.eofToken.info;
  local_38._M_t.
  super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
  .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl =
       (tuple<slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
        )(_Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
          )0x0;
  std::
  __uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  ::reset((__uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
           *)this_01,__p_00);
  std::
  unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>::
  ~unique_ptr((unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
               *)&local_38);
  if (local_110.interfacePorts.
      super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.interfacePorts.
                    super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.interfacePorts.
                          super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.interfacePorts.
                          super__Vector_base<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.classDecls.
      super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.classDecls.
                    super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.classDecls.
                          super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.classDecls.
                          super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.packageImports.
      super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.packageImports.
                    super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.packageImports.
                          super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.packageImports.
                          super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.classPackageNames.
      super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.classPackageNames.
                    super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.classPackageNames.
                          super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.classPackageNames.
                          super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.globalInstances.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(local_110.globalInstances.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.elements_,
                    local_110.globalInstances.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_size_mask * 0x100 + 0x100);
  }
  if (local_110.nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(local_110.nodeMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                    .arrays.elements_,
                    ((local_110.nodeMap.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                      .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
  }
  peVar2 = (parent->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar2 != (element_type *)0x0) {
    ppDVar3 = (peVar2->macros).
              super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((peVar2->macros).
        super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppDVar3) {
      uVar4 = 0;
      do {
        local_110.nodeMap.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
        .arrays.groups_size_index = (size_t)ppDVar3[uVar4];
        if ((DefineDirectiveSyntax *)
            local_110.nodeMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
            .arrays.groups_size_index == (DefineDirectiveSyntax *)0x0) {
          local_110.nodeMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
          .arrays.groups_size_index = 0;
        }
        else {
          local_110.nodeMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
          .arrays.groups_size_index =
               (size_t)deepClone((SyntaxNode *)
                                 local_110.nodeMap.table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                                 .arrays.groups_size_index,this_00);
        }
        __position._M_current =
             (this->macros).
             super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->macros).
            super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
          ::_M_realloc_insert<slang::syntax::DefineDirectiveSyntax_const*const&>
                    ((vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
                      *)&this->macros,__position,(DefineDirectiveSyntax **)&local_110);
        }
        else {
          *__position._M_current =
               (DefineDirectiveSyntax *)
               local_110.nodeMap.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
               .arrays.groups_size_index;
          pppDVar1 = &(this->macros).
                      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + 1;
        }
        uVar4 = uVar4 + 1;
        peVar2 = (parent->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
        ppDVar3 = (peVar2->macros).
                  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(peVar2->macros).
                                     super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3
                              ));
    }
    if ((((this_01->_M_t).
          super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
          ._M_t.
          super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
          .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl)->eofToken).
        info == (Info *)0x0) {
      TVar5 = parsing::Token::deepClone
                        ((Token *)((long)(peVar2->metadata)._M_t.
                                         super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
                                         .
                                         super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>
                                  + 0xc0),this_00);
      ((this_01->_M_t).
       super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
       ._M_t.
       super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
       .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl)->eofToken =
           TVar5;
    }
  }
  return;
}

Assistant:

SyntaxTree::SyntaxTree(SyntaxNode* root, SourceManager& sourceManager, BumpAllocator&& alloc,
                       const SourceLibrary* library, const std::shared_ptr<SyntaxTree>& parent) :
    rootNode(root), library(library), sourceMan(sourceManager), alloc(std::move(alloc)) {
    metadata = std::make_unique<ParserMetadata>(ParserMetadata::fromSyntax(*root));
    if (parent) { // copy parent's info
        for (size_t i = 0; i < parent->macros.size(); ++i) {
            auto macro = parent->macros[i];
            if (macro)
                macro = deepClone(*macro, this->alloc);
            macros.push_back(macro);
        }
        if (!metadata->eofToken)
            metadata->eofToken = parent->getMetadata().eofToken.deepClone(this->alloc);
    }
}